

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_accept(intptr_t srv_uuid)

{
  int iVar1;
  int __fd;
  socklen_t local_74;
  int local_70;
  socklen_t size;
  int optval_1;
  int optval;
  int local_60;
  socklen_t local_5c;
  int client;
  socklen_t addrlen;
  sockaddr_in6 addrinfo [2];
  intptr_t srv_uuid_local;
  
  local_5c = 0x38;
  _optval_1 = (sockaddr *)&client;
  __fd = (int)((ulong)srv_uuid >> 8);
  local_60 = accept4(__fd,_optval_1,&local_5c,0x80800);
  if (local_60 < 1) {
    srv_uuid_local = -1;
  }
  else {
    size = 1;
    setsockopt(local_60,6,1,&size,4);
    local_70 = 0;
    local_74 = 4;
    iVar1 = getsockopt(local_60,1,7,&local_70,&local_74);
    if ((iVar1 == 0) && (local_70 < 0x20001)) {
      local_70 = 0x20000;
      setsockopt(local_60,1,7,&local_70,4);
      local_70 = 0x20000;
      setsockopt(local_60,1,8,&local_70,4);
    }
    fio_lock((fio_lock_i *)((long)fio_data + (long)local_60 * 0xa8 + 0x6c));
    fio_clear_fd((long)local_60,'\x01');
    fio_unlock((fio_lock_i *)((long)fio_data + (long)local_60 * 0xa8 + 0x6c));
    if ((ushort)client == 1) {
      *(undefined1 *)((long)fio_data + (long)local_60 * 0xa8 + 0x71) =
           *(undefined1 *)((long)fio_data + (long)__fd * 0xa8 + 0x71);
      if (*(char *)((long)fio_data + (long)__fd * 0xa8 + 0x71) != '\0') {
        memcpy((void *)((long)fio_data + (long)local_60 * 0xa8 + 0x72),
               (void *)((long)fio_data + (long)__fd * 0xa8 + 0x72),
               (long)(int)(*(byte *)((long)fio_data + (long)__fd * 0xa8 + 0x71) + 1));
      }
    }
    else {
      fio_tcp_addr_cpy(local_60,(uint)(ushort)client,(sockaddr *)&client);
    }
    srv_uuid_local =
         (intptr_t)CONCAT41(local_60,*(undefined1 *)((long)fio_data + (long)local_60 * 0xa8 + 0x6d))
    ;
  }
  return srv_uuid_local;
}

Assistant:

intptr_t fio_accept(intptr_t srv_uuid) {
  struct sockaddr_in6 addrinfo[2]; /* grab a slice of stack (aligned) */
  socklen_t addrlen = sizeof(addrinfo);
  int client;
#ifdef SOCK_NONBLOCK
  client = accept4(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen,
                   SOCK_NONBLOCK | SOCK_CLOEXEC);
  if (client <= 0)
    return -1;
#else
  client = accept(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen);
  if (client <= 0)
    return -1;
  if (fio_set_non_block(client) == -1) {
    close(client);
    return -1;
  }
#endif
  // avoid the TCP delay algorithm.
  {
    int optval = 1;
    setsockopt(client, IPPROTO_TCP, TCP_NODELAY, &optval, sizeof(optval));
  }
  // handle socket buffers.
  {
    int optval = 0;
    socklen_t size = (socklen_t)sizeof(optval);
    if (!getsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, &size) &&
        optval <= 131072) {
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, sizeof(optval));
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_RCVBUF, &optval, sizeof(optval));
    }
  }

  fio_lock(&fd_data(client).protocol_lock);
  fio_clear_fd(client, 1);
  fio_unlock(&fd_data(client).protocol_lock);
  /* copy peer address */
  if (((struct sockaddr *)addrinfo)->sa_family == AF_UNIX) {
    fd_data(client).addr_len = uuid_data(srv_uuid).addr_len;
    if (uuid_data(srv_uuid).addr_len) {
      memcpy(fd_data(client).addr, uuid_data(srv_uuid).addr,
             uuid_data(srv_uuid).addr_len + 1);
    }
  } else {
    fio_tcp_addr_cpy(client, ((struct sockaddr *)addrinfo)->sa_family,
                     (struct sockaddr *)addrinfo);
  }

  return fd2uuid(client);
}